

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_> __thiscall kj::_::FiberBase::fire(FiberBase *this)

{
  bool bVar1;
  FiberStack *this_00;
  Event *extraout_RDX;
  long in_RSI;
  Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_> MVar2;
  Fault local_58;
  Fault f;
  Type *local_48;
  undefined1 local_40 [8];
  DebugComparison<kj::_::FiberBase::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_inl_h:1348:3)_&,_kj::_::FiberBase::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_inl_h:1348:3)>
  _kjCondition;
  FiberBase *this_local;
  
  local_48 = (Type *)DebugExpressionStart::operator<<
                               ((DebugExpressionStart *)&_::MAGIC_ASSERT,(Type *)(in_RSI + 0x50));
  f.exception._4_4_ = 0;
  DebugExpression<kj::_::FiberBase::{unnamed_type#1}&>::operator==
            ((DebugComparison<kj::_::FiberBase::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_inl_h:1348:3)_&,_kj::_::FiberBase::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_inl_h:1348:3)>
              *)local_40,(DebugExpression<kj::_::FiberBase::_unnamed_type_1_&> *)&local_48,
             (Type *)((long)&f.exception + 4));
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_40);
  if (!bVar1) {
    Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<kj::_::FiberBase::_unnamed_type_1_&,_unnamed_type_1_>&>
              (&local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
               ,0x672,FAILED,"state == WAITING","_kjCondition,",
               (DebugComparison<kj::_::FiberBase::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_inl_h:1348:3)_&,_kj::_::FiberBase::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_inl_h:1348:3)>
                *)local_40);
    Debug::Fault::fatal(&local_58);
  }
  *(undefined4 *)(in_RSI + 0x50) = 1;
  this_00 = Own<kj::_::FiberStack,_std::nullptr_t>::operator->
                      ((Own<kj::_::FiberStack,_std::nullptr_t> *)(in_RSI + 0x68));
  FiberStack::switchToFiber(this_00);
  Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_>::Maybe
            ((Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_> *)this);
  MVar2.ptr.ptr = extraout_RDX;
  MVar2.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_>)MVar2.ptr;
}

Assistant:

Maybe<Own<Event>> FiberBase::fire() {
  KJ_ASSERT(state == WAITING);
  state = RUNNING;
  stack->switchToFiber();
  return kj::none;
}